

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O2

_Bool borg_think_shop_grab_interesting(void)

{
  borg_item_conflict *pbVar1;
  borg_item_conflict *pbVar2;
  long lVar3;
  _Bool _Var4;
  wchar_t wVar5;
  int iVar6;
  int32_t iVar7;
  angband_constants *paVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int32_t local_50;
  wchar_t local_4c;
  wchar_t local_48;
  int32_t local_44;
  ulong local_40;
  long local_38;
  
  local_50 = 0;
  if ((borg.trait[0x107] == 0) && (0xe < borg.trait[0x23])) {
    _Var4 = false;
    borg_notice_home((borg_item_conflict *)0x0,true);
    local_44 = borg_power_home();
    wVar5 = borg_first_empty_inventory_slot();
    if ((wVar5 != L'\xffffffff') &&
       (_Var4 = false, wVar5 + L'\x01' < (int)((uint)z_info->pack_size - borg.trait[0x9e]))) {
      local_40 = 0;
      borg_notice_home((borg_item_conflict *)0x0,false);
      iVar6 = borg_power_home();
      local_38 = (long)wVar5;
      iVar12 = 0;
      local_4c = L'\xffffffff';
      paVar8 = z_info;
      local_48 = local_4c;
      for (lVar10 = 0; lVar10 < (long)((ulong)paVar8->store_max - 1); lVar10 = lVar10 + 1) {
        lVar9 = 0;
        for (uVar11 = 0; uVar11 < paVar8->store_inven_max; uVar11 = uVar11 + 1) {
          pbVar1 = borg_shops[lVar10].ware;
          if (pbVar1->curses[lVar9 + -0x26] != false) {
            _Var4 = borg_good_buy((borg_item_conflict *)(pbVar1->desc + lVar9),(wchar_t)lVar10,
                                  (wchar_t)uVar11);
            lVar3 = local_38;
            if ((_Var4) &&
               ((long)*(int *)(pbVar1->curses + lVar9 + -10) * 5 + 1000 <= (long)borg.trait[0x2d]))
            {
              if ((pbVar1->curses[lVar9 + -0x2a] & 0xfeU) == 0x16) {
                local_40 = (ulong)(ushort)(*(short *)(pbVar1->curses + lVar9 + -0x28) /
                                          (short)(ushort)pbVar1->curses[lVar9 + -0x26]);
              }
              memcpy(borg_items + local_38,(borg_shops[lVar10].ware)->desc + lVar9,0x388);
              wVar5 = borg_min_item_quantity((borg_item_conflict *)(pbVar1->desc + lVar9));
              pbVar2 = borg_items;
              borg_items[lVar3].iqty = (uint8_t)wVar5;
              if ((pbVar1->curses[lVar9 + -0x2a] & 0xfeU) == 0x16) {
                pbVar2[lVar3].pval = (short)wVar5 * (short)local_40;
              }
              borg_notice_home((borg_item_conflict *)((borg_shops[lVar10].ware)->desc + lVar9),false
                              );
              iVar7 = borg_power_home();
              if ((local_44 < iVar7) && (_Var4 = borg_think_home_sell_useful(&local_50), _Var4)) {
                iVar13 = wVar5 * *(int *)(pbVar1->curses + lVar9 + -10);
                if (borg.trait[0x2d] / 10 < iVar13) {
                  local_50 = local_50 - iVar13;
                }
                if ((iVar6 <= local_50) && (iVar13 < iVar12 || local_50 != iVar6)) {
                  iVar12 = iVar13;
                  iVar6 = local_50;
                  local_4c = (wchar_t)uVar11;
                  local_48 = (wchar_t)lVar10;
                }
              }
            }
          }
          lVar9 = lVar9 + 0x388;
          paVar8 = z_info;
        }
      }
      borg_items[local_38].iqty = '\0';
      _Var4 = false;
      borg_notice_home((borg_item_conflict *)0x0,false);
      borg_power_home();
      borg.goal.item = -1;
      borg.goal.shop = -1;
      borg.goal.ware = -1;
      if ((L'\xffffffff' < local_48) && (L'\xffffffff' < local_4c)) {
        borg.goal.ware = (int16_t)local_4c;
        borg.goal.shop = (int16_t)local_48;
        _Var4 = true;
      }
    }
  }
  else {
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

bool borg_think_shop_grab_interesting(void)
{
    int k, b_k = -1;
    int n, b_n = -1;
    int qty   = 1;
    int charge_each = 0;

    int32_t s = 0L, b_s = 0L;
    int32_t c, b_c      = 0L;
    int32_t borg_empty_home_power;
    int     hole;

    /* Don't do this if Sauron is dead */
    if (borg.trait[BI_SAURON_DEAD])
        return false;

    /* not until later-- use that money for better equipment */
    if (borg.trait[BI_CLEVEL] < 15)
        return false;

    /* get what an empty home would have for power */
    borg_notice_home(NULL, true);
    borg_empty_home_power = borg_power_home();

    hole                  = borg_first_empty_inventory_slot();

    /* Require two empty slots */
    if (hole == -1)
        return false;
    if (hole + 1 >= PACK_SLOTS)
        return false;

    /* Examine the home */
    borg_notice_home(NULL, false);

    /* Evaluate the home */
    b_s = borg_power_home();

    /* Check the shops (max -1 to skip home) */
    for (k = 0; k < (z_info->store_max - 1); k++) {
        /* Scan the wares */
        for (n = 0; n < z_info->store_inven_max; n++) {
            borg_item *item = &borg_shops[k].ware[n];

            /* Skip empty items */
            if (!item->iqty)
                continue;

            /* Skip "bad" buys */
            if (!borg_good_buy(item, k, n))
                continue;

            /* Don't buy easy spell books late in the game */
            /* Hack -- Require some "extra" cash */
            if (borg.trait[BI_GOLD] < 1000L + item->cost * 5)
                continue;

            /* for wands and staffs adjust charges */
            if (item->tval == TV_STAFF || item->tval == TV_WAND)
                charge_each = item->pval / item->iqty;

            /* make this the next to last item that the player has */
            /* (can't make it the last or it thinks that both player and */
            /*  home are full) */
            memcpy(
                &borg_items[hole], &borg_shops[k].ware[n], sizeof(borg_item));

            /* Save the number */
            qty = borg_min_item_quantity(item);

            /* Give a single item */
            borg_items[hole].iqty = qty;

            /* for wands and staffs adjust charges */
            if (item->tval == TV_STAFF || item->tval == TV_WAND)
                borg_items[hole].pval = charge_each * qty;

            /* make sure this item would help an empty home */
            borg_notice_home(&borg_shops[k].ware[n], false);
            if (borg_empty_home_power >= borg_power_home())
                continue;

            /* optimize the home inventory */
            if (!borg_think_home_sell_useful(&s))
                continue;

            /* Obtain the "cost" of the item */
            c = item->cost * qty;

            /* Penalize expensive items */
            if (c > borg.trait[BI_GOLD] / 10)
                s -= c;

            /* Ignore "bad" sales */
            if (s < b_s)
                continue;

            /* Ignore "expensive" purchases */
            if ((s == b_s) && (c >= b_c))
                continue;

            /* Save the item and cost */
            b_k = k;
            b_n = n;
            b_s = s;
            b_c = c;
        }
    }

    /* restore inventory hole (just make sure the last slot goes back to */
    /* empty) */
    borg_items[hole].iqty = 0;

    /* Examine the real home */
    borg_notice_home(NULL, false);

    /* Evaluate the home */
    s = borg_power_home();

    /* remove the target that optimizing the home gave */
    borg.goal.shop = borg.goal.ware = borg.goal.item = -1;

    /* Buy something */
    if ((b_k >= 0) && (b_n >= 0)) {
        /* Visit that shop */
        borg.goal.shop = b_k;

        /* Buy that item */
        borg.goal.ware = b_n;

        /* Success */
        return true;
    }

    /* Nope */
    return false;
}